

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void FileMappingCleanupRoutine
               (CPalThread *pThread,IPalObject *pObjectToCleanup,bool fShutdown,
               bool fCleanupSharedState)

{
  bool bVar1;
  undefined8 *puStack_38;
  bool fDataChanged;
  IDataLock *pLocalDataLock;
  CFileMappingProcessLocalData *pLocalData;
  CFileMappingImmutableData *pImmutableData;
  PAL_ERROR palError;
  bool fCleanupSharedState_local;
  bool fShutdown_local;
  IPalObject *pObjectToCleanup_local;
  CPalThread *pThread_local;
  
  pImmutableData._0_4_ = 0;
  pLocalData = (CFileMappingProcessLocalData *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  puStack_38 = (undefined8 *)0x0;
  pImmutableData._6_1_ = fCleanupSharedState;
  pImmutableData._7_1_ = fShutdown;
  _palError = pObjectToCleanup;
  pObjectToCleanup_local = (IPalObject *)pThread;
  if (fCleanupSharedState) {
    pImmutableData._0_4_ = (*pObjectToCleanup->_vptr_IPalObject[2])(pObjectToCleanup,&pLocalData);
    if ((int)pImmutableData != 0) {
      fprintf(_stderr,"] %s %s:%d","FileMappingCleanupRoutine",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
              ,0xab);
      fprintf(_stderr,"Unable to obtain immutable data for object to be reclaimed");
      return;
    }
    if (pLocalData[0x402].UnixFd != 0) {
      unlink((char *)pLocalData);
    }
  }
  if ((pImmutableData._7_1_ & 1) == 0) {
    pImmutableData._0_4_ =
         (*_palError->_vptr_IPalObject[3])
                   (_palError,pObjectToCleanup_local,1,&stack0xffffffffffffffc8,&pLocalDataLock);
    if ((int)pImmutableData == 0) {
      bVar1 = *(int *)&pLocalDataLock->_vptr_IDataLock != -1;
      if (bVar1) {
        close(*(int *)&pLocalDataLock->_vptr_IDataLock);
        *(undefined4 *)&pLocalDataLock->_vptr_IDataLock = 0xffffffff;
      }
      (**(code **)*puStack_38)(puStack_38,pObjectToCleanup_local,bVar1);
    }
    else {
      fprintf(_stderr,"] %s %s:%d","FileMappingCleanupRoutine",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
              ,0xc5);
      fprintf(_stderr,"Unable to obtain process local data for object to be reclaimed");
    }
  }
  return;
}

Assistant:

void
FileMappingCleanupRoutine(
    CPalThread *pThread,
    IPalObject *pObjectToCleanup,
    bool fShutdown,
    bool fCleanupSharedState
    )
{
    PAL_ERROR palError = NO_ERROR;
    CFileMappingImmutableData *pImmutableData = NULL;
    CFileMappingProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    bool fDataChanged = FALSE;

    if (TRUE == fCleanupSharedState)
    {
        //
        // If we created a temporary file to back this mapping we need
        // to unlink it now
        //
        
        palError = pObjectToCleanup->GetImmutableData(
            reinterpret_cast<void**>(&pImmutableData)
            );

        if (NO_ERROR != palError)
        {
            ASSERT("Unable to obtain immutable data for object to be reclaimed");
            return;
        }

        if (pImmutableData->bPALCreatedTempFile)
        {
            unlink(pImmutableData->szFileName);
        }
    }

    if (FALSE == fShutdown)
    {
        //
        // We only need to close the object's descriptor if we're not
        // shutting down
        //
        
        palError = pObjectToCleanup->GetProcessLocalData(
            pThread,
            WriteLock,
            &pLocalDataLock,
            reinterpret_cast<void**>(&pLocalData)
            );

        if (NO_ERROR != palError)
        {
            ASSERT("Unable to obtain process local data for object to be reclaimed");
            return;
        }

        if (-1 != pLocalData->UnixFd)
        {
            close(pLocalData->UnixFd);
            pLocalData->UnixFd = -1;
            fDataChanged = TRUE;
        }

        pLocalDataLock->ReleaseLock(pThread, fDataChanged);
    }

    //
    // Why don't we need to deal with any views that may have been created
    // from this mapping? If the process is shutting down then there's nothing
    // that we need to take care of, as the OS will remove the underlying
    // mappings when the process goes away. If we're not shutting down then
    // there's no way for a view to exist against this mapping, since each
    // view holds a reference against the mapping object.
    //
}